

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O2

double __thiscall
HACD::ICHUll::ComputeDistance
          (ICHUll *this,long name,Vec3<double> *pt,Vec3<double> *normal,bool *insideHull,
          bool updateIncidentPoints)

{
  CircularListElement<HACD::TMMTriangle> *pCVar1;
  CircularListElement<HACD::TMMVertex> *pCVar2;
  CircularListElement<HACD::TMMVertex> *pCVar3;
  long lVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  CircularListElement<HACD::TMMTriangle> *pCVar12;
  bool bVar13;
  Real RVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dist;
  Vec3<double> faceNormal;
  Vec3<double> ver2;
  Vec3<double> ver1;
  Vec3<double> ver0;
  double local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  Vec3<double> local_c0;
  undefined1 local_a8 [16];
  double local_98;
  undefined1 local_88 [16];
  double local_78;
  undefined1 local_68 [16];
  double local_58;
  Vec3<double> local_48;
  
  RVar14 = 0.0;
  if (this->m_isFlat == false) {
    local_48.m_data[2] = pt->m_data[2];
    local_48.m_data[0] = pt->m_data[0];
    local_48.m_data[1] = pt->m_data[1];
    pCVar12 = (CircularListElement<HACD::TMMTriangle> *)0x0;
    local_c8 = normal->m_data[2];
    local_d8 = *(undefined1 (*) [16])normal->m_data;
    auVar18 = ZEXT864(0);
    sVar11 = (this->m_mesh).m_triangles.m_size;
    *insideHull = false;
    local_e0 = name;
    while( true ) {
      bVar13 = sVar11 == 0;
      sVar11 = sVar11 - 1;
      RVar14 = auVar18._0_8_;
      if (bVar13) break;
      pCVar1 = (this->m_mesh).m_triangles.m_head;
      pCVar2 = (pCVar1->m_data).m_vertices[0];
      pCVar3 = (pCVar1->m_data).m_vertices[1];
      lVar9 = (pCVar2->m_data).m_name;
      lVar4 = (pCVar3->m_data).m_name;
      if (lVar9 != lVar4) {
        pCVar5 = (pCVar1->m_data).m_vertices[2];
        lVar6 = (pCVar5->m_data).m_name;
        if ((lVar4 != lVar6) && (lVar6 != lVar9)) {
          if ((lVar6 == name) || ((lVar9 == name || (lVar4 == name)))) {
            local_e8 = 0.0;
            auVar22 = ZEXT816(0) << 0x40;
LAB_00d91e89:
            if ((*insideHull != true) || (auVar18._0_8_ < auVar22._0_8_)) {
              *insideHull = true;
              auVar18 = ZEXT1664(auVar22);
              pCVar12 = (this->m_mesh).m_triangles.m_head;
            }
          }
          else {
            local_68 = *(undefined1 (*) [16])(pCVar2->m_data).m_pos.m_data;
            local_58 = (pCVar2->m_data).m_pos.m_data[2];
            local_88 = *(undefined1 (*) [16])(pCVar3->m_data).m_pos.m_data;
            auVar8 = vsubpd_avx(local_88,local_68);
            local_78 = (pCVar3->m_data).m_pos.m_data[2];
            auVar22 = vshufpd_avx(auVar8,auVar8,1);
            local_a8 = *(undefined1 (*) [16])(pCVar5->m_data).m_pos.m_data;
            auVar16 = vsubpd_avx(local_a8,local_68);
            local_98 = (pCVar5->m_data).m_pos.m_data[2];
            auVar7 = vshufpd_avx(auVar16,auVar16,1);
            auVar19._8_8_ = 0;
            auVar19._0_8_ = local_98 - local_58;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = auVar7._0_8_ * (local_78 - local_58);
            auVar15 = vfmsub231sd_fma(auVar24,auVar22,auVar19);
            auVar20._8_8_ = 0;
            auVar20._0_8_ = (local_98 - local_58) * auVar8._0_8_;
            auVar23._8_8_ = 0;
            auVar23._0_8_ = local_78 - local_58;
            auVar17 = vfmsub231sd_fma(auVar20,auVar16,auVar23);
            local_c0.m_data[0] = auVar15._0_8_;
            auVar15._8_8_ = 0;
            auVar15._0_8_ = auVar16._0_8_ * auVar22._0_8_;
            auVar22 = vfmsub231sd_fma(auVar15,auVar8,auVar7);
            local_c0.m_data[1] = auVar17._0_8_;
            local_c0.m_data[2] = auVar22._0_8_;
            Vec3<double>::Normalize(&local_c0);
            auVar16._8_8_ = 0;
            auVar16._0_8_ = local_d8._0_8_;
            auVar7._8_8_ = 0;
            auVar7._0_8_ = normal->m_data[0];
            auVar21._8_8_ = 0;
            auVar21._0_8_ = (double)local_d8._8_8_ * normal->m_data[1];
            auVar22 = vfmadd231sd_fma(auVar21,auVar16,auVar7);
            auVar17._8_8_ = 0;
            auVar17._0_8_ = local_c8;
            auVar8._8_8_ = 0;
            auVar8._0_8_ = normal->m_data[2];
            auVar22 = vfmadd132sd_fma(auVar17,auVar22,auVar8);
            if (0.0 < auVar22._0_8_) {
              lVar9 = IntersectRayTriangle
                                (&local_48,(Vec3<double> *)local_d8,(Vec3<double> *)local_68,
                                 (Vec3<double> *)local_88,(Vec3<double> *)local_a8,&local_e8);
              if (lVar9 == 1) {
                auVar22._8_8_ = 0;
                auVar22._0_8_ = local_e8;
                auVar18 = ZEXT864((ulong)RVar14);
                goto LAB_00d91e89;
              }
            }
            auVar18 = ZEXT864((ulong)RVar14);
          }
        }
      }
      if ((this->m_mesh).m_triangles.m_size != 0) {
        (this->m_mesh).m_triangles.m_head = ((this->m_mesh).m_triangles.m_head)->m_next;
      }
    }
    if ((updateIncidentPoints && pCVar12 != (CircularListElement<HACD::TMMTriangle> *)0x0) &&
       (this->m_distPoints !=
        (map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
         *)0x0)) {
      pmVar10 = std::
                map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
                ::operator[](this->m_distPoints,&local_e0);
      pmVar10->m_dist = RVar14;
      SArray<long,_16UL>::Insert(&(pCVar12->m_data).m_incidentPoints,&local_e0);
    }
  }
  return RVar14;
}

Assistant:

double ICHUll::ComputeDistance(long name, const Vec3<Real> & pt, const Vec3<Real> & normal, bool & insideHull, bool updateIncidentPoints)
	{
		if (m_isFlat)
		{
			return  0.0;
		}
		else
		{
			Vec3<double> p0( static_cast<double>(pt.X()), 
							 static_cast<double>(pt.Y()), 
							 static_cast<double>(pt.Z()));

			Vec3<double> ptNormal(static_cast<double>(normal.X()), 
								  static_cast<double>(normal.Y()), 
								  static_cast<double>(normal.Z()));
			Vec3<double> impact;
			long nhit;
			double dist;
			double distance = 0.0; 
			size_t nT = m_mesh.GetNTriangles();
			insideHull = false;
			CircularListElement<TMMTriangle> * face = 0;
			Vec3<double> ver0, ver1, ver2;
			for(size_t f = 0; f < nT; f++)
			{
				TMMTriangle & currentTriangle = m_mesh.m_triangles.GetHead()->GetData();
                nhit = 0;
				if (currentTriangle.m_vertices[0]->GetData().m_name != currentTriangle.m_vertices[1]->GetData().m_name &&
					currentTriangle.m_vertices[1]->GetData().m_name != currentTriangle.m_vertices[2]->GetData().m_name &&
					currentTriangle.m_vertices[2]->GetData().m_name != currentTriangle.m_vertices[0]->GetData().m_name)
				{
					if (currentTriangle.m_vertices[0]->GetData().m_name == name ||
						currentTriangle.m_vertices[1]->GetData().m_name == name ||
						currentTriangle.m_vertices[2]->GetData().m_name == name)
					{
						nhit = 1;
						dist = 0.0;
					}
					else
					{
						ver0.X() = currentTriangle.m_vertices[0]->GetData().m_pos.X();
						ver0.Y() = currentTriangle.m_vertices[0]->GetData().m_pos.Y();
						ver0.Z() = currentTriangle.m_vertices[0]->GetData().m_pos.Z();
						ver1.X() = currentTriangle.m_vertices[1]->GetData().m_pos.X();
						ver1.Y() = currentTriangle.m_vertices[1]->GetData().m_pos.Y();
						ver1.Z() = currentTriangle.m_vertices[1]->GetData().m_pos.Z();
						ver2.X() = currentTriangle.m_vertices[2]->GetData().m_pos.X();
						ver2.Y() = currentTriangle.m_vertices[2]->GetData().m_pos.Y();
						ver2.Z() = currentTriangle.m_vertices[2]->GetData().m_pos.Z();
						Vec3<Real> faceNormal = (ver1-ver0) ^ (ver2-ver0);
						faceNormal.Normalize();
						if (ptNormal*normal > 0.0)
						{
							nhit = IntersectRayTriangle(p0, ptNormal, ver0, ver1, ver2, dist);
						}                        
					}
#ifdef HACD_DEBUG
					std::cout << "T " << currentTriangle.m_vertices[0]->GetData().m_name << " "
									  << currentTriangle.m_vertices[1]->GetData().m_name << " "
									  << currentTriangle.m_vertices[2]->GetData().m_name << " "
									  << nhit << " " << dist << std::endl;
#endif
					if (nhit == 1 && (!insideHull || dist > distance) )
					{
						distance = dist;
						insideHull = true;
						face = m_mesh.m_triangles.GetHead();
					}
				}
				m_mesh.m_triangles.Next();
			}
			if (updateIncidentPoints && face && m_distPoints)
			{
				(*m_distPoints)[name].m_dist = static_cast<Real>(distance);
				face->GetData().m_incidentPoints.Insert(name);
			}
			return distance;
		}
	}